

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::handle
          (InterlockedResourceAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  StorageClass SVar1;
  Compiler *pCVar2;
  Compiler *pCVar3;
  bool bVar4;
  uint32_t uVar5;
  Variant *this_00;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  SPIRVariable *pSVar8;
  SPIRVariable *var_4;
  uint32_t ptr_5;
  SPIRVariable *var_3;
  uint32_t ptr_4;
  SPIRVariable *src_var;
  SPIRVariable *dst_var;
  uint32_t src;
  uint32_t dst;
  SPIRVariable *var_2;
  uint32_t ptr_3;
  SPIRVariable *var_1;
  SPIRExpression *local_78;
  SPIRExpression *e;
  uint32_t ptr_2;
  uint32_t id_2;
  uint32_t result_type_2;
  uint32_t local_5c;
  uint32_t ptr_1;
  uint32_t id_1;
  SPIRType *type;
  uint32_t local_48;
  uint32_t result_type_1;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t id;
  uint32_t result_type;
  SPIRVariable *var;
  uint32_t ptr;
  uint32_t length_local;
  uint32_t *args_local;
  InterlockedResourceAccessHandler *pIStack_18;
  Op opcode_local;
  InterlockedResourceAccessHandler *this_local;
  
  if ((this->use_critical_section & 1U) != 0) {
    if (opcode == OpBeginInvocationInterlockEXT) {
      this->in_crit_sec = true;
      return true;
    }
    if (opcode == OpEndInvocationInterlockEXT) {
      return false;
    }
  }
  var._4_4_ = length;
  _ptr = args;
  args_local._4_4_ = opcode;
  pIStack_18 = this;
  switch(opcode) {
  case OpImageTexelPointer:
    if (length < 3) {
      return false;
    }
    ptr_2 = *args;
    e._4_4_ = args[1];
    e._0_4_ = args[2];
    var_1._7_1_ = 1;
    local_78 = set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                         (this->compiler,e._4_4_,(char (*) [1])0x5df766,&ptr_2,
                          (bool *)((long)&var_1 + 7));
    pSVar8 = maybe_get_backing_variable(this->compiler,(uint32_t)e);
    if (pSVar8 != (SPIRVariable *)0x0) {
      (local_78->loaded_from).id = (pSVar8->super_IVariant).self.id;
    }
    break;
  case OpLoad:
    if (length < 3) {
      return false;
    }
    var._0_4_ = args[2];
    _id = maybe_get_backing_variable(this->compiler,(uint32_t)var);
    if (_id != (SPIRVariable *)0x0) {
      SVar1 = _id->storage;
      if (SVar1 == StorageClassUniformConstant) {
        local_3c = *_ptr;
        local_40 = _ptr[1];
        result_type_1._3_1_ = 1;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,local_40,(char (*) [1])0x5df766,&local_3c,
                   (bool *)((long)&result_type_1 + 3));
        register_read(this->compiler,local_40,(uint32_t)var,true);
      }
      else {
        if (SVar1 == StorageClassUniform) {
          pCVar2 = this->compiler;
          pCVar3 = this->compiler;
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(_id->super_IVariant).field_0xc);
          pSVar7 = get<spirv_cross::SPIRType>(pCVar3,uVar5);
          local_48 = (pSVar7->super_IVariant).self.id;
          bVar4 = has_decoration(pCVar2,(ID)local_48,DecorationBufferBlock);
          if (!bVar4) {
            return true;
          }
        }
        else if (SVar1 != StorageClassStorageBuffer) {
          return true;
        }
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_id->super_IVariant).self);
        access_potential_resource(this,uVar5);
      }
    }
    break;
  case OpStore:
  case OpImageWrite:
  case OpAtomicStore:
    if (length == 0) {
      return false;
    }
    pSVar8 = maybe_get_backing_variable(this->compiler,*args);
    if ((pSVar8 != (SPIRVariable *)0x0) &&
       (((pSVar8->storage == StorageClassUniform || (pSVar8->storage == StorageClassUniformConstant)
         ) || (pSVar8->storage == StorageClassStorageBuffer)))) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar8->super_IVariant).self);
      access_potential_resource(this,uVar5);
    }
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    uVar5 = args[1];
    pSVar8 = maybe_get_backing_variable(this->compiler,*args);
    pSVar6 = maybe_get_backing_variable(this->compiler,uVar5);
    if ((pSVar8 != (SPIRVariable *)0x0) &&
       ((pSVar8->storage == StorageClassUniform || (pSVar8->storage == StorageClassStorageBuffer))))
    {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar8->super_IVariant).self);
      access_potential_resource(this,uVar5);
    }
    if ((pSVar6 != (SPIRVariable *)0x0) &&
       ((pSVar6->storage == StorageClassUniform || (pSVar6->storage == StorageClassStorageBuffer))))
    {
      if (pSVar6->storage == StorageClassUniform) {
        pCVar2 = this->compiler;
        pCVar3 = this->compiler;
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSVar6->super_IVariant).field_0xc);
        pSVar7 = get<spirv_cross::SPIRType>(pCVar3,uVar5);
        bVar4 = has_decoration(pCVar2,(ID)(pSVar7->super_IVariant).self.id,DecorationBufferBlock);
        if (!bVar4) {
          return true;
        }
      }
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      access_potential_resource(this,uVar5);
    }
    break;
  default:
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (length < 3) {
      return false;
    }
    type._4_4_ = *args;
    _ptr_1 = get<spirv_cross::SPIRType>(this->compiler,type._4_4_);
    if (((_ptr_1->storage == StorageClassUniform) ||
        (_ptr_1->storage == StorageClassUniformConstant)) ||
       (_ptr_1->storage == StorageClassStorageBuffer)) {
      local_5c = _ptr[1];
      result_type_2 = _ptr[2];
      id_2._3_1_ = 1;
      set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                (this->compiler,local_5c,(char (*) [1])0x5df766,(uint *)((long)&type + 4),
                 (bool *)((long)&id_2 + 3));
      register_read(this->compiler,local_5c,result_type_2,true);
      this_00 = VectorView<spirv_cross::Variant>::operator[]
                          (&(this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>,
                           (ulong)local_5c);
      Variant::set_allow_type_rewrite(this_00);
    }
    break;
  case OpImageRead:
  case OpAtomicLoad:
    if (length < 3) {
      return false;
    }
    pSVar8 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar8 != (SPIRVariable *)0x0) {
      SVar1 = pSVar8->storage;
      if (SVar1 != StorageClassUniformConstant) {
        if (SVar1 == StorageClassUniform) {
          pCVar2 = this->compiler;
          pCVar3 = this->compiler;
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSVar8->super_IVariant).field_0xc);
          pSVar7 = get<spirv_cross::SPIRType>(pCVar3,uVar5);
          bVar4 = has_decoration(pCVar2,(ID)(pSVar7->super_IVariant).self.id,DecorationBufferBlock);
          if (!bVar4) {
            return true;
          }
        }
        else if (SVar1 != StorageClassStorageBuffer) {
          return true;
        }
      }
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar8->super_IVariant).self);
      access_potential_resource(this,uVar5);
    }
    break;
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
    if (length < 3) {
      return false;
    }
    pSVar8 = maybe_get_backing_variable(this->compiler,args[2]);
    if ((pSVar8 != (SPIRVariable *)0x0) &&
       (((pSVar8->storage == StorageClassUniform || (pSVar8->storage == StorageClassUniformConstant)
         ) || (pSVar8->storage == StorageClassStorageBuffer)))) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar8->super_IVariant).self);
      access_potential_resource(this,uVar5);
    }
  }
  return true;
}

Assistant:

bool Compiler::InterlockedResourceAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Only care about critical section analysis if we have simple case.
	if (use_critical_section)
	{
		if (opcode == OpBeginInvocationInterlockEXT)
		{
			in_crit_sec = true;
			return true;
		}

		if (opcode == OpEndInvocationInterlockEXT)
		{
			// End critical section--nothing more to do.
			return false;
		}
	}

	// We need to figure out where images and buffers are loaded from, so do only the bare bones compilation we need.
	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// We're only concerned with buffer and image memory here.
		if (!var)
			break;

		switch (var->storage)
		{
		default:
			break;

		case StorageClassUniformConstant:
		{
			uint32_t result_type = args[0];
			uint32_t id = args[1];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
			break;
		}

		case StorageClassUniform:
			// Must have BufferBlock; we only care about SSBOs.
			if (!compiler.has_decoration(compiler.get<SPIRType>(var->basetype).self, DecorationBufferBlock))
				break;
			// fallthrough
		case StorageClassStorageBuffer:
			access_potential_resource(var->self);
			break;
		}
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		if (type.storage == StorageClassUniform || type.storage == StorageClassUniformConstant ||
		    type.storage == StorageClassStorageBuffer)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
			compiler.ir.ids[id].set_allow_type_rewrite();
		}
		break;
	}

	case OpImageTexelPointer:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];
		auto &e = compiler.set<SPIRExpression>(id, "", result_type, true);
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var)
			e.loaded_from = var->self;
		break;
	}

	case OpStore:
	case OpImageWrite:
	case OpAtomicStore:
	{
		if (length < 1)
			return false;

		uint32_t ptr = args[0];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var && (var->storage == StorageClassUniform || var->storage == StorageClassUniformConstant ||
		            var->storage == StorageClassStorageBuffer))
		{
			access_potential_resource(var->self);
		}

		break;
	}

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		uint32_t dst = args[0];
		uint32_t src = args[1];
		auto *dst_var = compiler.maybe_get_backing_variable(dst);
		auto *src_var = compiler.maybe_get_backing_variable(src);

		if (dst_var && (dst_var->storage == StorageClassUniform || dst_var->storage == StorageClassStorageBuffer))
			access_potential_resource(dst_var->self);

		if (src_var)
		{
			if (src_var->storage != StorageClassUniform && src_var->storage != StorageClassStorageBuffer)
				break;

			if (src_var->storage == StorageClassUniform &&
			    !compiler.has_decoration(compiler.get<SPIRType>(src_var->basetype).self, DecorationBufferBlock))
			{
				break;
			}

			access_potential_resource(src_var->self);
		}

		break;
	}

	case OpImageRead:
	case OpAtomicLoad:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// We're only concerned with buffer and image memory here.
		if (!var)
			break;

		switch (var->storage)
		{
		default:
			break;

		case StorageClassUniform:
			// Must have BufferBlock; we only care about SSBOs.
			if (!compiler.has_decoration(compiler.get<SPIRType>(var->basetype).self, DecorationBufferBlock))
				break;
			// fallthrough
		case StorageClassUniformConstant:
		case StorageClassStorageBuffer:
			access_potential_resource(var->self);
			break;
		}
		break;
	}

	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var && (var->storage == StorageClassUniform || var->storage == StorageClassUniformConstant ||
		            var->storage == StorageClassStorageBuffer))
		{
			access_potential_resource(var->self);
		}

		break;
	}

	default:
		break;
	}

	return true;
}